

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O2

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,QPixmap *pixmap,BindOptions options)

{
  char cVar1;
  unsigned_long_long key;
  BindResult BVar2;
  QOpenGLCachedTexture *pQVar3;
  undefined8 *puVar4;
  BindResult BVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  unsigned_long_long local_60 [3];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QPixmap::isNull();
  if (cVar1 != '\0') {
    BVar5.id = 0;
    BVar5.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
    super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
         (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
    goto LAB_0015b1f6;
  }
  local_48._0_8_ = &this->m_mutex;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
  local_48[8] = true;
  key = QPixmap::cacheKey();
  if (*(short *)(pixmap + 8) == 0) {
    local_60[0] = key;
    pQVar3 = QCache<unsigned_long_long,_QOpenGLCachedTexture>::relink(&this->m_cache,local_60);
    if ((pQVar3 == (QOpenGLCachedTexture *)0x0) ||
       ((QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>)
        (pQVar3->m_options).super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
        super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i !=
        (QFlagsStorage<QOpenGLTextureUploader::BindOption>)
        options.super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
        super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i)) goto LAB_0015b156;
    puVar4 = (undefined8 *)QOpenGLContext::functions();
    (**(code **)*puVar4)(0xde1,*(undefined4 *)(pQVar3->m_resource + 0x10));
    BVar2.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
    super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
         (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
    BVar2.id = *(uint *)(pQVar3->m_resource + 0x10);
    uVar6 = 0;
  }
  else {
LAB_0015b156:
    QPixmap::toImage();
    BVar2 = bindTexture(this,context,key,(QImage *)local_60,options);
    uVar6 = (ulong)BVar2 >> 0x20;
    QImage::~QImage((QImage *)local_60);
    if (BVar2.id == 0) {
      BVar2.id = 0;
      BVar2.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
      super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
           (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
    }
    else {
      QImagePixmapCleanupHooks::enableCleanupHooks(pixmap);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  BVar5 = (BindResult)((ulong)BVar2 & 0xffffffff | uVar6 << 0x20);
LAB_0015b1f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return BVar5;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 const QPixmap &pixmap,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    if (pixmap.isNull())
        return { 0, {} };
    QMutexLocker locker(&m_mutex);
    qint64 key = pixmap.cacheKey();

    // A QPainter is active on the image - take the safe route and replace the texture.
    if (!pixmap.paintingActive()) {
        QOpenGLCachedTexture *entry = m_cache.object(key);
        if (entry && entry->options() == options) {
            context->functions()->glBindTexture(GL_TEXTURE_2D, entry->id());
            return { entry->id(), {} };
        }
    }

    BindResult result = bindTexture(context, key, pixmap.toImage(), options);
    if (result.id > 0)
        QImagePixmapCleanupHooks::enableCleanupHooks(pixmap);

    return result;
}